

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_DXT.c
# Opt level: O0

void LSE_master_colors_max_min(int *cmax,int *cmin,int channels,uchar *uncompressed)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float dot;
  float vec_len2;
  float dot_min;
  float dot_max;
  float sum_x2 [3];
  float sum_x [3];
  int c1 [3];
  int c0 [3];
  int j;
  int i;
  uchar *uncompressed_local;
  int channels_local;
  int *cmin_local;
  int *cmax_local;
  
  memset(sum_x2 + 1,0,0xc);
  memset(&dot_min,0,0xc);
  if ((2 < channels) && (channels < 5)) {
    compute_color_line_STDEV(uncompressed,channels,sum_x2 + 1,&dot_min);
    fVar3 = 1.0 / (sum_x2[0] * sum_x2[0] + dot_max * dot_max + dot_min * dot_min + 1e-05);
    dot = sum_x2[0] * (float)uncompressed[2] +
          dot_min * (float)*uncompressed + dot_max * (float)uncompressed[1];
    vec_len2 = dot;
    for (c0[2] = 1; c0[2] < 0x10; c0[2] = c0[2] + 1) {
      fVar4 = sum_x2[0] * (float)uncompressed[c0[2] * channels + 2] +
              dot_min * (float)uncompressed[c0[2] * channels] +
              dot_max * (float)uncompressed[c0[2] * channels + 1];
      fVar5 = fVar4;
      if ((dot <= fVar4) && (fVar5 = dot, vec_len2 < fVar4)) {
        vec_len2 = fVar4;
      }
      dot = fVar5;
    }
    fVar5 = sum_x2[0] * sum_x[0] + dot_min * sum_x2[1] + dot_max * sum_x2[2];
    for (c0[2] = 0; c0[2] < 3; c0[2] = c0[2] + 1) {
      c1[(long)c0[2] + 1] =
           (int)(fVar3 * (vec_len2 - fVar5) * (&dot_min)[c0[2]] + sum_x2[(long)c0[2] + 1] + 0.5);
      if (c1[(long)c0[2] + 1] < 0) {
        c1[(long)c0[2] + 1] = 0;
      }
      else if (0xff < c1[(long)c0[2] + 1]) {
        c1[(long)c0[2] + 1] = 0xff;
      }
      sum_x[(long)c0[2] + 1] =
           (float)(int)(fVar3 * (dot - fVar5) * (&dot_min)[c0[2]] + sum_x2[(long)c0[2] + 1] + 0.5);
      if ((int)sum_x[(long)c0[2] + 1] < 0) {
        sum_x[(long)c0[2] + 1] = 0.0;
      }
      else if (0xff < (int)sum_x[(long)c0[2] + 1]) {
        sum_x[(long)c0[2] + 1] = 3.57331e-43;
      }
    }
    iVar1 = rgb_to_565(c1[1],c1[2],c0[0]);
    iVar2 = rgb_to_565((int)sum_x[1],(int)sum_x[2],c1[0]);
    if (iVar2 < iVar1) {
      *cmax = iVar1;
      *cmin = iVar2;
    }
    else {
      *cmax = iVar2;
      *cmin = iVar1;
    }
  }
  return;
}

Assistant:

void LSE_master_colors_max_min(
		int *cmax, int *cmin,
		int channels,
		const unsigned char *const uncompressed )
{
	int i, j;
	/*	the master colors	*/
	int c0[3], c1[3];
	/*	used for fitting the line	*/
	float sum_x[] = { 0.0f, 0.0f, 0.0f };
	float sum_x2[] = { 0.0f, 0.0f, 0.0f };
	float dot_max = 1.0f, dot_min = -1.0f;
	float vec_len2 = 0.0f;
	float dot;
	/*	error check	*/
	if( (channels < 3) || (channels > 4) )
	{
		return;
	}
	compute_color_line_STDEV( uncompressed, channels, sum_x, sum_x2 );
	vec_len2 = 1.0f / ( 0.00001f +
			sum_x2[0]*sum_x2[0] + sum_x2[1]*sum_x2[1] + sum_x2[2]*sum_x2[2] );
	/*	finding the max and min vector values	*/
	dot_max =
			(
				sum_x2[0] * uncompressed[0] +
				sum_x2[1] * uncompressed[1] +
				sum_x2[2] * uncompressed[2]
			);
	dot_min = dot_max;
	for( i = 1; i < 16; ++i )
	{
		dot =
			(
				sum_x2[0] * uncompressed[i*channels+0] +
				sum_x2[1] * uncompressed[i*channels+1] +
				sum_x2[2] * uncompressed[i*channels+2]
			);
		if( dot < dot_min )
		{
			dot_min = dot;
		} else if( dot > dot_max )
		{
			dot_max = dot;
		}
	}
	/*	and the offset (from the average location)	*/
	dot = sum_x2[0]*sum_x[0] + sum_x2[1]*sum_x[1] + sum_x2[2]*sum_x[2];
	dot_min -= dot;
	dot_max -= dot;
	/*	post multiply by the scaling factor	*/
	dot_min *= vec_len2;
	dot_max *= vec_len2;
	/*	OK, build the master colors	*/
	for( i = 0; i < 3; ++i )
	{
		/*	color 0	*/
		c0[i] = (int)(0.5f + sum_x[i] + dot_max * sum_x2[i]);
		if( c0[i] < 0 )
		{
			c0[i] = 0;
		} else if( c0[i] > 255 )
		{
			c0[i] = 255;
		}
		/*	color 1	*/
		c1[i] = (int)(0.5f + sum_x[i] + dot_min * sum_x2[i]);
		if( c1[i] < 0 )
		{
			c1[i] = 0;
		} else if( c1[i] > 255 )
		{
			c1[i] = 255;
		}
	}
	/*	down_sample (with rounding?)	*/
	i = rgb_to_565( c0[0], c0[1], c0[2] );
	j = rgb_to_565( c1[0], c1[1], c1[2] );
	if( i > j )
	{
		*cmax = i;
		*cmin = j;
	} else
	{
		*cmax = j;
		*cmin = i;
	}
}